

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

LengthPercentage
Rml::ComputeLengthPercentage
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  NumericValue value;
  float fVar1;
  float dp_ratio_local;
  float document_font_size_local;
  float font_size_local;
  Property *property_local;
  Vector2f vp_dimensions_local;
  
  if (property->unit == PERCENT) {
    fVar1 = Property::Get<float>(property);
    Style::LengthPercentage::LengthPercentage
              ((LengthPercentage *)&vp_dimensions_local,Percentage,fVar1);
  }
  else {
    value = Property::GetNumericValue(property);
    fVar1 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
    Style::LengthPercentage::LengthPercentage((LengthPercentage *)&vp_dimensions_local,Length,fVar1)
    ;
  }
  return (LengthPercentage)vp_dimensions_local;
}

Assistant:

Style::LengthPercentage ComputeLengthPercentage(const Property* property, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	using namespace Style;
	if (property->unit == Unit::PERCENT)
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	return LengthPercentage(LengthPercentage::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}